

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::Errors::RBDLFileParseError::RBDLFileParseError
          (RBDLFileParseError *this,string *text)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)text);
  RBDLError::RBDLError(&this->super_RBDLError,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_RBDLError = &PTR__RBDLError_0027c978;
  return;
}

Assistant:

RBDLFileParseError::RBDLFileParseError(std::string text): RBDLError(text) {}